

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode UA_Client_disconnect(UA_Client *client)

{
  UA_Boolean UVar1;
  UA_StatusCode UVar2;
  uint local_1c;
  UA_StatusCode retval;
  UA_Client *client_local;
  
  if (client->state == UA_CLIENTSTATE_READY) {
    client_local._4_4_ = 0x808a0000;
  }
  else {
    local_1c = 0;
    if ((client->connection).state == UA_CONNECTION_ESTABLISHED) {
      UVar1 = UA_NodeId_equal(&client->authenticationToken,&UA_NODEID_NULL);
      if (!UVar1) {
        local_1c = CloseSession(client);
      }
    }
    if ((client->connection).state == UA_CONNECTION_ESTABLISHED) {
      UVar2 = CloseSecureChannel(client);
      local_1c = UVar2 | local_1c;
    }
    client_local._4_4_ = local_1c;
  }
  return client_local._4_4_;
}

Assistant:

UA_StatusCode UA_Client_disconnect(UA_Client *client) {
    if(client->state == UA_CLIENTSTATE_READY)
        return UA_STATUSCODE_BADNOTCONNECTED;
    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    /* Is a session established? */
    if(client->connection.state == UA_CONNECTION_ESTABLISHED &&
       !UA_NodeId_equal(&client->authenticationToken, &UA_NODEID_NULL))
        retval = CloseSession(client);
    /* Is a secure channel established? */
    if(client->connection.state == UA_CONNECTION_ESTABLISHED)
        retval |= CloseSecureChannel(client);
    return retval;
}